

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.c
# Opt level: O0

void Parse(void *yyp,int yymajor,int64_t yyminor,calculator_t *state)

{
  byte yyNewState;
  char local_49;
  ulong uStack_48;
  char cDiv;
  yyStackEntry *i;
  yyParser *yypParser;
  int yyendofinput;
  uchar yyact;
  YYMINORTYPE yyminorunion;
  calculator_t *state_local;
  int64_t yyminor_local;
  void *pvStack_10;
  int yymajor_local;
  void *yyp_local;
  
  *(calculator_t **)((long)yyp + 0x10) = state;
  yyminorunion = (YYMINORTYPE)state;
  state_local = (calculator_t *)yyminor;
  yyminor_local._4_4_ = yymajor;
  pvStack_10 = yyp;
  if (*yyp == 0) {
    __assert_fail("yypParser->yytos!=0",
                  "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                  ,0x524,"void Parse(void *, int, int64_t, calculator_t *)");
  }
  yypParser._7_1_ = **yyp;
  if (yyTraceFILE != (FILE *)0x0) {
    if (yypParser._7_1_ < 0x48) {
      fprintf((FILE *)yyTraceFILE,"%sInput \'%s\' in state %d\n",yyTracePrompt,yyTokenName[yymajor],
              (ulong)yypParser._7_1_);
    }
    else {
      fprintf((FILE *)yyTraceFILE,"%sInput \'%s\' with pending reduce %d\n",yyTracePrompt,
              yyTokenName[yymajor],(ulong)(yypParser._7_1_ - 0x48));
    }
  }
  while( true ) {
    if (yypParser._7_1_ != **yyp) {
      __assert_fail("yyact==yypParser->yytos->stateno",
                    "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                    ,0x537,"void Parse(void *, int, int64_t, calculator_t *)");
    }
    yyNewState = yy_find_shift_action((uchar)yyminor_local._4_4_,yypParser._7_1_);
    if (yyNewState < 0x48) break;
    yypParser._7_1_ =
         yy_reduce((yyParser *)yyp,yyNewState - 0x48,yyminor_local._4_4_,(int64_t)state_local);
    if (*yyp <= (long)yyp + 0x18U) {
LAB_00102e1a:
      if (yyTraceFILE != (FILE *)0x0) {
        local_49 = '[';
        fprintf((FILE *)yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
        for (uStack_48 = (long)yyp + 0x28; uStack_48 <= *yyp; uStack_48 = uStack_48 + 0x10) {
          fprintf((FILE *)yyTraceFILE,"%c%s",(ulong)(uint)(int)local_49,
                  yyTokenName[*(byte *)(uStack_48 + 1)]);
          local_49 = ' ';
        }
        fprintf((FILE *)yyTraceFILE,"]\n");
      }
      return;
    }
  }
  if (yyNewState < 0x45) {
    yy_shift((yyParser *)yyp,yyNewState,(uchar)yyminor_local._4_4_,(int64_t)state_local);
    *(int *)((long)yyp + 8) = *(int *)((long)yyp + 8) + -1;
  }
  else {
    if (yyNewState == 0x46) {
      *(long *)yyp = *yyp + -0x10;
      yy_accept((yyParser *)yyp);
      return;
    }
    if (yyNewState != 0x45) {
      __assert_fail("yyact == YY_ERROR_ACTION",
                    "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                    ,0x547,"void Parse(void *, int, int64_t, calculator_t *)");
    }
    _yyendofinput = (YYMINORTYPE)state_local;
    if (yyTraceFILE != (FILE *)0x0) {
      fprintf((FILE *)yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
    }
    if (*(int *)((long)yyp + 8) < 1) {
      yy_syntax_error((yyParser *)yyp,yyminor_local._4_4_,(int64_t)state_local);
    }
    *(undefined4 *)((long)yyp + 8) = 3;
    yy_destructor((yyParser *)yyp,(uchar)yyminor_local._4_4_,(YYMINORTYPE *)&yyendofinput);
    if (yymajor == 0) {
      yy_parse_failed((yyParser *)yyp);
      *(undefined4 *)((long)yyp + 8) = 0xffffffff;
    }
  }
  goto LAB_00102e1a;
}

Assistant:

void Parse(
  void *yyp,                   /* The parser */
  int yymajor,                 /* The major token code number */
  ParseTOKENTYPE yyminor       /* The value for the token */
  ParseARG_PDECL               /* Optional %extra_argument parameter */
){
  YYMINORTYPE yyminorunion;
  YYACTIONTYPE yyact;   /* The parser action. */
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  int yyendofinput;     /* True if we are at the end of input */
#endif
#ifdef YYERRORSYMBOL
  int yyerrorhit = 0;   /* True if yymajor has invoked an error */
#endif
  yyParser *yypParser = (yyParser*)yyp;  /* The parser */
  ParseCTX_FETCH
  ParseARG_STORE

  assert( yypParser->yytos!=0 );
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  yyendofinput = (yymajor==0);
#endif

  yyact = yypParser->yytos->stateno;
#ifndef NDEBUG
  if( yyTraceFILE ){
    if( yyact < YY_MIN_REDUCE ){
      fprintf(yyTraceFILE,"%sInput '%s' in state %d\n",
              yyTracePrompt,yyTokenName[yymajor],yyact);
    }else{
      fprintf(yyTraceFILE,"%sInput '%s' with pending reduce %d\n",
              yyTracePrompt,yyTokenName[yymajor],yyact-YY_MIN_REDUCE);
    }
  }
#endif

  do{
    assert( yyact==yypParser->yytos->stateno );
    yyact = yy_find_shift_action((YYCODETYPE)yymajor,yyact);
    if( yyact >= YY_MIN_REDUCE ){
      yyact = yy_reduce(yypParser,yyact-YY_MIN_REDUCE,yymajor,
                        yyminor ParseCTX_PARAM);
    }else if( yyact <= YY_MAX_SHIFTREDUCE ){
      yy_shift(yypParser,yyact,(YYCODETYPE)yymajor,yyminor);
#ifndef YYNOERRORRECOVERY
      yypParser->yyerrcnt--;
#endif
      break;
    }else if( yyact==YY_ACCEPT_ACTION ){
      yypParser->yytos--;
      yy_accept(yypParser);
      return;
    }else{
      assert( yyact == YY_ERROR_ACTION );
      yyminorunion.yy0 = yyminor;
#ifdef YYERRORSYMBOL
      int yymx;
#endif
#ifndef NDEBUG
      if( yyTraceFILE ){
        fprintf(yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
      }
#endif
#ifdef YYERRORSYMBOL
      /* A syntax error has occurred.
      ** The response to an error depends upon whether or not the
      ** grammar defines an error token "ERROR".  
      **
      ** This is what we do if the grammar does define ERROR:
      **
      **  * Call the %syntax_error function.
      **
      **  * Begin popping the stack until we enter a state where
      **    it is legal to shift the error symbol, then shift
      **    the error symbol.
      **
      **  * Set the error count to three.
      **
      **  * Begin accepting and shifting new tokens.  No new error
      **    processing will occur until three tokens have been
      **    shifted successfully.
      **
      */
      if( yypParser->yyerrcnt<0 ){
        yy_syntax_error(yypParser,yymajor,yyminor);
      }
      yymx = yypParser->yytos->major;
      if( yymx==YYERRORSYMBOL || yyerrorhit ){
#ifndef NDEBUG
        if( yyTraceFILE ){
          fprintf(yyTraceFILE,"%sDiscard input token %s\n",
             yyTracePrompt,yyTokenName[yymajor]);
        }
#endif
        yy_destructor(yypParser, (YYCODETYPE)yymajor, &yyminorunion);
        yymajor = YYNOCODE;
      }else{
        while( yypParser->yytos >= yypParser->yystack
            && (yyact = yy_find_reduce_action(
                        yypParser->yytos->stateno,
                        YYERRORSYMBOL)) > YY_MAX_SHIFTREDUCE
        ){
          yy_pop_parser_stack(yypParser);
        }
        if( yypParser->yytos < yypParser->yystack || yymajor==0 ){
          yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
          yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
          yypParser->yyerrcnt = -1;
#endif
          yymajor = YYNOCODE;
        }else if( yymx!=YYERRORSYMBOL ){
          yy_shift(yypParser,yyact,YYERRORSYMBOL,yyminor);
        }
      }
      yypParser->yyerrcnt = 3;
      yyerrorhit = 1;
      if( yymajor==YYNOCODE ) break;
      yyact = yypParser->yytos->stateno;
#elif defined(YYNOERRORRECOVERY)
      /* If the YYNOERRORRECOVERY macro is defined, then do not attempt to
      ** do any kind of error recovery.  Instead, simply invoke the syntax
      ** error routine and continue going as if nothing had happened.
      **
      ** Applications can set this macro (for example inside %include) if
      ** they intend to abandon the parse upon the first syntax error seen.
      */
      yy_syntax_error(yypParser,yymajor, yyminor);
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      break;
#else  /* YYERRORSYMBOL is not defined */
      /* This is what we do if the grammar does not define ERROR:
      **
      **  * Report an error message, and throw away the input token.
      **
      **  * If the input token is $, then fail the parse.
      **
      ** As before, subsequent error messages are suppressed until
      ** three input tokens have been successfully shifted.
      */
      if( yypParser->yyerrcnt<=0 ){
        yy_syntax_error(yypParser,yymajor, yyminor);
      }
      yypParser->yyerrcnt = 3;
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      if( yyendofinput ){
        yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
        yypParser->yyerrcnt = -1;
#endif
      }
      break;
#endif
    }
  }while( yypParser->yytos>yypParser->yystack );
#ifndef NDEBUG
  if( yyTraceFILE ){
    yyStackEntry *i;
    char cDiv = '[';
    fprintf(yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
    for(i=&yypParser->yystack[1]; i<=yypParser->yytos; i++){
      fprintf(yyTraceFILE,"%c%s", cDiv, yyTokenName[i->major]);
      cDiv = ' ';
    }
    fprintf(yyTraceFILE,"]\n");
  }
#endif
  return;
}